

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

walk_result __thiscall
jsoncons::jsonschema::
min_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_validate(min_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *context,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
             json_pointer *instance_location,evaluation_results *param_5,error_reporter *reporter,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *param_7)

{
  validation_message *pvVar1;
  bool bVar2;
  walk_result wVar3;
  size_t sVar4;
  char *__lhs;
  json_pointer *pjVar5;
  undefined8 in_RCX;
  string *in_RDI;
  validation_message *in_R9;
  walk_result result;
  string message;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  validation_message *in_stack_fffffffffffffdb0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffdb8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  uint uVar6;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffde0;
  unsigned_long in_stack_fffffffffffffde8;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [48];
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_70;
  validation_message *local_38;
  undefined8 local_28;
  walk_result local_4;
  
  local_38 = in_R9;
  local_28 = in_RCX;
  bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    (in_stack_fffffffffffffdc8);
  if (!bVar2) {
    return advance;
  }
  keyword_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::
  keyword_name_abi_cxx11_
            ((keyword_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
              *)in_RDI);
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(in_stack_fffffffffffffde0,
                 (eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),in_RDI);
  sVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                    (in_stack_fffffffffffffdb8);
  pvVar1 = in_stack_fffffffffffffdb0;
  if (sVar4 < *(ulong *)(in_RDI + 7)) {
    std::__cxx11::to_string(in_stack_fffffffffffffde8);
    std::operator+((char *)in_stack_fffffffffffffdb8,&in_stack_fffffffffffffdb0->keyword_);
    std::__cxx11::string::~string(local_c0);
    __lhs = (char *)basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                              (in_stack_fffffffffffffdb8);
    std::__cxx11::to_string(in_stack_fffffffffffffde8);
    std::operator+(__lhs,&in_stack_fffffffffffffdb0->keyword_);
    std::__cxx11::string::append(local_a0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    pjVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             ::eval_path(&local_70);
    (**(code **)(*(long *)in_RDI + 0x10))(&stack0xfffffffffffffde0,in_RDI,pjVar5,local_28,local_a0);
    wVar3 = error_reporter::error
                      ((error_reporter *)local_38,
                       (validation_message *)
                       CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    validation_message::~validation_message(local_38);
    if (wVar3 == abort) {
      local_4 = abort;
    }
    uVar6 = (uint)(wVar3 == abort);
    std::__cxx11::string::~string(local_a0);
    pvVar1 = local_38;
    if (uVar6 != 0) goto LAB_00744b87;
  }
  local_38 = pvVar1;
  local_4 = advance;
LAB_00744b87:
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::~eval_context((eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *)local_38);
  return local_4;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter,
            Json& /*patch*/) const final
        {
            if (!instance.is_array())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            if (instance.size() < min_items_)
            {
                std::string message("Minimum number of items is " + std::to_string(min_items_));
                message.append(" but found " + std::to_string(instance.size()));
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    std::move(message)));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }          
            return walk_result::advance;
        }